

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_Elastic_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Collision_Elastic_PDU::Encode(Collision_Elastic_PDU *this,KDataStream *stream)

{
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_IssuingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_IssuingEntityID,stream);
  (*(this->m_CollidingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_CollidingEntityID,stream);
  (*(this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EventID,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding1);
  (*(this->m_ContactVelocity).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_ContactVelocity,stream);
  KDataStream::Write<float>(stream,(float)this->m_f32Mass);
  (*(this->m_Location).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Location,stream);
  KDataStream::Write<float>(stream,(float)this->m_f32CIRXX);
  KDataStream::Write<float>(stream,(float)this->m_f32CIRXY);
  KDataStream::Write<float>(stream,(float)this->m_f32CIRXZ);
  KDataStream::Write<float>(stream,(float)this->m_f32CIRYY);
  KDataStream::Write<float>(stream,(float)this->m_f32CIRYZ);
  KDataStream::Write<float>(stream,(float)this->m_f32CIRZZ);
  (*(this->m_UnitSurfaceNormal).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_UnitSurfaceNormal,stream);
  KDataStream::Write<float>(stream,(float)this->m_f32COR);
  return;
}

Assistant:

void Collision_Elastic_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );
    stream << KDIS_STREAM m_IssuingEntityID
           << KDIS_STREAM m_CollidingEntityID
           << KDIS_STREAM m_EventID
           << m_ui16Padding1
           << KDIS_STREAM m_ContactVelocity
           << m_f32Mass
           << KDIS_STREAM m_Location
           << m_f32CIRXX
           << m_f32CIRXY
           << m_f32CIRXZ
           << m_f32CIRYY
           << m_f32CIRYZ
           << m_f32CIRZZ
           << KDIS_STREAM m_UnitSurfaceNormal
           << m_f32COR;
}